

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O2

QString * __thiscall
Win32MakefileGenerator::escapeDependencyPath
          (QString *__return_storage_ptr__,Win32MakefileGenerator *this,QString *path)

{
  qsizetype qVar1;
  Data *pDVar2;
  char cVar3;
  int iVar4;
  QString *pQVar5;
  char16_t *pcVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&path->d);
  if ((__return_storage_ptr__->d).size != 0) {
    if (escapeDependencyPath(QString_const&)::criticalChars == '\0') {
      iVar4 = __cxa_guard_acquire(&escapeDependencyPath(QString_const&)::criticalChars);
      if (iVar4 != 0) {
        local_48.d = (Data *)0x0;
        local_60.d = (Data *)0x0;
        local_60.ptr = (char16_t *)0x0;
        local_48.ptr = L"([\t #])";
        local_60.size = 0;
        local_48.size = 7;
        QRegularExpression::QRegularExpression
                  ((QRegularExpression *)&escapeDependencyPath(QString_const&)::criticalChars,
                   &local_48,0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
        __cxa_atexit(QRegularExpression::~QRegularExpression,
                     &escapeDependencyPath(QString_const&)::criticalChars,&__dso_handle);
        __cxa_guard_release(&escapeDependencyPath(QString_const&)::criticalChars);
      }
    }
    cVar3 = QString::contains((QRegularExpression *)__return_storage_ptr__,
                              (QRegularExpressionMatch *)
                              &escapeDependencyPath(QString_const&)::criticalChars);
    if (cVar3 != '\0') {
      local_60.d = (Data *)0x2236a5;
      local_60.size = 0x2236a5;
      local_60.ptr = (char16_t *)__return_storage_ptr__;
      QStringBuilder<QStringBuilder<const_char_(&)[2],_QString_&>,_const_char_(&)[2]>::
      convertTo<QString>((QString *)&local_48,
                         (QStringBuilder<QStringBuilder<const_char_(&)[2],_QString_&>,_const_char_(&)[2]>
                          *)&local_60);
      pDVar2 = (__return_storage_ptr__->d).d;
      pcVar6 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_48.d;
      (__return_storage_ptr__->d).ptr = local_48.ptr;
      qVar1 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_48.size;
      local_48.d = pDVar2;
      local_48.ptr = pcVar6;
      local_48.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    }
    if (Option::debug_level != 0) {
      QString::toLatin1_helper((QString *)&local_48);
      pcVar6 = local_48.ptr;
      if (local_48.ptr == (char16_t *)0x0) {
        pcVar6 = (char16_t *)&QByteArray::_empty;
      }
      QString::toLatin1_helper((QString *)&local_60);
      pQVar5 = (QString *)local_60.ptr;
      if ((QString *)local_60.ptr == (QString *)0x0) {
        pQVar5 = (QString *)&QByteArray::_empty;
      }
      debug_msg_internal(2,"EscapeDependencyPath: %s -> %s",pcVar6,pQVar5);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_60);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString Win32MakefileGenerator::escapeDependencyPath(const QString &path) const
{
    QString ret = path;
    if (!ret.isEmpty()) {
        static const QRegularExpression criticalChars(QStringLiteral("([\t #])"));
        if (ret.contains(criticalChars))
            ret = "\"" + ret + "\"";
        debug_msg(2, "EscapeDependencyPath: %s -> %s", path.toLatin1().constData(), ret.toLatin1().constData());
    }
    return ret;
}